

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::BindingRenderCase::iterate(BindingRenderCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  bool bVar3;
  Surface *pSVar4;
  char *description;
  void *__buf;
  void *__buf_00;
  int iVar5;
  qpTestResult testResult;
  int iVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  Surface surface;
  Surface error;
  size_type __dnew;
  Surface local_370;
  string local_358;
  Surface local_338;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  LogImageSet local_280;
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [4];
  ios_base local_1c8 [264];
  LogImage local_c0;
  
  tcu::Surface::Surface(&local_370,0x40,0x40);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&local_370);
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_338,local_370.m_width,local_370.m_height);
  poVar1 = (ostringstream *)(local_240 + 8);
  local_240._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying image contents.",0x19);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1c8);
  if (0 < local_370.m_height) {
    bVar3 = true;
    iVar5 = 0;
    do {
      if (0 < local_370.m_width) {
        iVar6 = 0;
        do {
          uVar2 = *(uint *)((long)local_370.m_pixels.m_ptr +
                           (long)(local_370.m_width * iVar5 + iVar6) * 4);
          bVar8 = (~(uVar2 >> 8) & 0xff) < 0x15;
          bVar9 = (uVar2 & 0xff0000) < 0x140001;
          uVar7 = 0xff0000ff;
          if (bVar9 && bVar8) {
            uVar7 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_338.m_pixels.m_ptr + (long)(local_338.m_width * iVar5 + iVar6) * 4) = uVar7;
          bVar3 = (bool)(bVar3 & (bVar9 && bVar8));
          iVar6 = iVar6 + 1;
        } while (iVar6 < local_370.m_width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_370.m_height);
    if (!bVar3) {
      poVar1 = (ostringstream *)(local_240 + 8);
      local_240._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image verification failed.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1c8);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      local_240._0_8_ = (TestLog *)0x12;
      local_358._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)local_240);
      local_358.field_2._M_allocated_capacity = local_240._0_8_;
      builtin_strncpy(local_358._M_dataplus._M_p,"Verfication result",0x12);
      local_358._M_string_length = local_240._0_8_;
      local_358._M_dataplus._M_p[local_240._0_8_] = '\0';
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_240._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x13;
      local_320._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)local_240);
      local_320.field_2._M_allocated_capacity = local_240._0_8_;
      builtin_strncpy(local_320._M_dataplus._M_p,"Result of rendering",0x13);
      local_320._M_string_length = local_240._0_8_;
      local_320._M_dataplus._M_p[local_240._0_8_] = '\0';
      tcu::LogImageSet::LogImageSet(&local_280,&local_358,&local_320);
      tcu::TestLog::startImageSet
                ((TestLog *)&this_00->_M_allocated_capacity,local_280.m_name._M_dataplus._M_p,
                 local_280.m_description._M_dataplus._M_p);
      local_2a0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_2a0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_2a0._M_string_length = 6;
      local_2a0.field_2._M_local_buf[6] = '\0';
      local_2c0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_2c0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_2c0._M_string_length = 6;
      local_2c0.field_2._M_local_buf[6] = '\0';
      pSVar4 = &local_370;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)local_240,&local_2a0,&local_2c0,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_240,(int)this_00,__buf,(size_t)pSVar4);
      local_2e0.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_2e0.field_2._8_2_ = 0x6b;
      local_2e0._M_string_length = 9;
      local_300.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_300.field_2._8_2_ = 0x6b73;
      local_300._M_string_length = 10;
      local_300.field_2._M_local_buf[10] = '\0';
      pSVar4 = &local_338;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      tcu::LogImage::LogImage(&local_c0,&local_2e0,&local_300,pSVar4,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_c0,(int)this_00,__buf_00,(size_t)pSVar4);
      tcu::TestLog::endImageSet((TestLog *)&this_00->_M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
        operator_delete(local_c0.m_description._M_dataplus._M_p,
                        local_c0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
        operator_delete(local_c0.m_name._M_dataplus._M_p,
                        local_c0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != local_210) {
        operator_delete(local_220._M_p,local_210[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._0_8_ != &local_230) {
        operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,
                        CONCAT17(local_2c0.field_2._M_local_buf[7],
                                 CONCAT16(local_2c0.field_2._M_local_buf[6],
                                          CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                                   local_2c0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        CONCAT17(local_2a0.field_2._M_local_buf[7],
                                 CONCAT16(local_2a0.field_2._M_local_buf[6],
                                          CONCAT24(local_2a0.field_2._M_allocated_capacity._4_2_,
                                                   local_2a0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
        operator_delete(local_280.m_description._M_dataplus._M_p,
                        local_280.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
        operator_delete(local_280.m_name._M_dataplus._M_p,
                        local_280.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,
                        (ulong)(local_358.field_2._M_allocated_capacity + 1));
      }
      tcu::Surface::~Surface(&local_338);
      testResult = (uint)this->m_unalignedData * 2 + QP_TEST_RESULT_FAIL;
      description = "Image verification failed";
      if (this->m_unalignedData != false) {
        description = "Failed to draw with unaligned data";
      }
      goto LAB_016a6693;
    }
  }
  poVar1 = (ostringstream *)(local_240 + 8);
  local_240._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Image verification passed.",0x1a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1c8);
  tcu::Surface::~Surface(&local_338);
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_016a6693:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_370);
  return STOP;
}

Assistant:

BindingRenderCase::IterateResult BindingRenderCase::iterate (void)
{
	tcu::Surface surface(TEST_RENDER_SIZE, TEST_RENDER_SIZE);

	// draw pattern

	renderTo(surface);

	// verify results

	if (verifyImageYellowGreen(surface, m_testCtx.getLog(), false))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else if (m_unalignedData)
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned data");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}